

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceMemoryVkImpl::DeviceMemoryVkImpl
          (DeviceMemoryVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDeviceVk,
          DeviceMemoryCreateInfo *MemCI)

{
  VulkanLogicalDevice *pVVar1;
  bool bVar2;
  uint32_t uVar3;
  TextureVkImpl *this_00;
  TextureDesc *pTVar4;
  VkImage vkImage;
  BufferVkImpl *this_01;
  BufferDesc *pBVar5;
  VkBuffer vkBuffer;
  Char *Message;
  DeviceMemoryWrapper local_128;
  ulong local_110;
  size_t i_1;
  unsigned_long local_100;
  unsigned_long PageCount;
  VkMemoryAllocateInfo MemAlloc;
  undefined1 local_c8 [4];
  uint32_t MemoryTypeIndex;
  string msg;
  uint local_98;
  BufferVkImpl *pBuffVk;
  RefCntAutoPtr<Diligent::IBufferVk> pBuffer;
  uint local_70;
  TextureVkImpl *pTexVk;
  RefCntAutoPtr<Diligent::ITextureVk> pTexture;
  IDeviceObject *pResource;
  Uint32 i;
  uint32_t MemoryTypeBits;
  VulkanLogicalDevice *LogicalDevice;
  VulkanPhysicalDevice *local_30;
  VulkanPhysicalDevice *PhysicalDevice;
  DeviceMemoryCreateInfo *MemCI_local;
  RenderDeviceVkImpl *pDeviceVk_local;
  IReferenceCounters *pRefCounters_local;
  DeviceMemoryVkImpl *this_local;
  
  PhysicalDevice = (VulkanPhysicalDevice *)MemCI;
  MemCI_local = (DeviceMemoryCreateInfo *)pDeviceVk;
  pDeviceVk_local = (RenderDeviceVkImpl *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  DeviceMemoryBase<Diligent::EngineVkImplTraits>::DeviceMemoryBase
            (&this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>,pRefCounters,pDeviceVk,
             MemCI);
  (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
  .super_ObjectBase<Diligent::IDeviceMemoryVk>.super_RefCountedObject<Diligent::IDeviceMemoryVk>.
  super_IDeviceMemoryVk.super_IDeviceMemory.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_010d01d8;
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
  ::vector(&this->m_Pages);
  this->m_MemoryTypeIndex = 0xffffffff;
  local_30 = RenderDeviceVkImpl::GetPhysicalDevice
                       ((this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                        .m_pDevice);
  _i = RenderDeviceVkImpl::GetLogicalDevice
                 ((this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                  .m_pDevice);
  if (*(int *)((PhysicalDevice->m_Properties).deviceName + 0xc) == 0) {
    LogError<true,char[41],char[60]>
              (false,"DeviceMemoryVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0x34,(char (*) [41])"Device memory create info is not valid: ",
               (char (*) [60])"Vulkan requires at least one resource to choose memory type");
  }
  if (*(long *)((PhysicalDevice->m_Properties).deviceName + 4) == 0) {
    LogError<true,char[41],char[39]>
              (false,"DeviceMemoryVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0x37,(char (*) [41])"Device memory create info is not valid: ",
               (char (*) [39])"ppCompatibleResources must not be null");
  }
  pResource._4_4_ = 0xffffffff;
  for (pResource._0_4_ = 0;
      (uint)pResource < *(uint *)((PhysicalDevice->m_Properties).deviceName + 0xc);
      pResource._0_4_ = (uint)pResource + 1) {
    pTexture.m_pObject =
         *(ITextureVk **)
          (*(long *)((PhysicalDevice->m_Properties).deviceName + 4) + (ulong)(uint)pResource * 8);
    RefCntAutoPtr<Diligent::ITextureVk>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::ITextureVk> *)&pTexVk,(IObject *)pTexture.m_pObject,
               (INTERFACE_ID *)IID_TextureVk);
    bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&pTexVk);
    if (bVar2) {
      this_00 = RefCntAutoPtr<Diligent::ITextureVk>::ConstPtr<Diligent::TextureVkImpl>
                          ((RefCntAutoPtr<Diligent::ITextureVk> *)&pTexVk);
      pTVar4 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          *)this_00);
      if (pTVar4->Usage != USAGE_SPARSE) {
        LogError<true,char[41],char[23],unsigned_int,char[36]>
                  (false,"DeviceMemoryVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                   ,0x42,(char (*) [41])"Device memory create info is not valid: ",
                   (char (*) [23])"ppCompatibleResources[",(uint *)&pResource,
                   (char (*) [36])"] must be created with USAGE_SPARSE");
      }
      pVVar1 = _i;
      vkImage = TextureVkImpl::GetVkImage(this_00);
      VulkanUtilities::VulkanLogicalDevice::GetImageMemoryRequirements
                ((VkMemoryRequirements *)&pBuffer,pVVar1,vkImage);
      pResource._4_4_ = local_70 & pResource._4_4_;
    }
    else {
      RefCntAutoPtr<Diligent::IBufferVk>::RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IBufferVk> *)&pBuffVk,(IObject *)pTexture.m_pObject,
                 (INTERFACE_ID *)IID_BufferVk);
      bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&pBuffVk);
      if (bVar2) {
        this_01 = RefCntAutoPtr<Diligent::IBufferVk>::ConstPtr<Diligent::BufferVkImpl>
                            ((RefCntAutoPtr<Diligent::IBufferVk> *)&pBuffVk);
        pBVar5 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                            *)this_01);
        if (pBVar5->Usage != USAGE_SPARSE) {
          LogError<true,char[41],char[23],unsigned_int,char[36]>
                    (false,"DeviceMemoryVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                     ,0x4a,(char (*) [41])"Device memory create info is not valid: ",
                     (char (*) [23])"ppCompatibleResources[",(uint *)&pResource,
                     (char (*) [36])"] must be created with USAGE_SPARSE");
        }
        pVVar1 = _i;
        vkBuffer = BufferVkImpl::GetVkBuffer(this_01);
        VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
                  ((VkMemoryRequirements *)((long)&msg.field_2 + 8),pVVar1,vkBuffer);
        pResource._4_4_ = local_98 & pResource._4_4_;
      }
      else {
        FormatString<char[26]>((string *)local_c8,(char (*) [26])"unsupported resource type");
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"DeviceMemoryVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                   ,0x50);
        std::__cxx11::string::~string((string *)local_c8);
      }
      RefCntAutoPtr<Diligent::IBufferVk>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IBufferVk> *)&pBuffVk);
    }
    RefCntAutoPtr<Diligent::ITextureVk>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::ITextureVk> *)&pTexVk);
  }
  if (pResource._4_4_ == 0) {
    LogError<true,char[41],char[54]>
              (false,"DeviceMemoryVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0x55,(char (*) [41])"Device memory create info is not valid: ",
               (char (*) [54])"ppCompatibleResources contains incompatible resources");
  }
  uVar3 = VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex(local_30,pResource._4_4_,1);
  if (uVar3 == 0xffffffff) {
    LogError<true,char[41],char[66]>
              (false,"DeviceMemoryVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0x5c,(char (*) [41])"Device memory create info is not valid: ",
               (char (*) [66])"Failed to find memory type for resources in ppCompatibleResources");
  }
  this->m_MemoryTypeIndex = uVar3;
  MemAlloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  MemAlloc._4_4_ = 0;
  PageCount = 5;
  MemAlloc.pNext =
       (void *)(this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
               .m_Desc.PageSize;
  MemAlloc.allocationSize = (VkDeviceSize)this->m_MemoryTypeIndex;
  i_1 = *(ulong *)&(PhysicalDevice->m_Properties).deviceType /
        (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
        .m_Desc.PageSize;
  local_100 = StaticCast<unsigned_long,unsigned_long>(&i_1);
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
  ::reserve(&this->m_Pages,local_100);
  for (local_110 = 0; local_110 < local_100; local_110 = local_110 + 1) {
    VulkanUtilities::VulkanLogicalDevice::AllocateDeviceMemory
              (&local_128,_i,(VkMemoryAllocateInfo *)&PageCount,
               (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    std::
    vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>>>
    ::
    emplace_back<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>>
              ((vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>>>
                *)&this->m_Pages,&local_128);
    VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>
    ::~VulkanObjectWrapper(&local_128);
  }
  return;
}

Assistant:

DeviceMemoryVkImpl::DeviceMemoryVkImpl(IReferenceCounters*           pRefCounters,
                                       RenderDeviceVkImpl*           pDeviceVk,
                                       const DeviceMemoryCreateInfo& MemCI) :
    TDeviceMemoryBase{pRefCounters, pDeviceVk, MemCI}
{
#define DEVMEM_CHECK_CREATE_INFO(...) \
    LOG_ERROR_AND_THROW("Device memory create info is not valid: ", __VA_ARGS__);

    const auto& PhysicalDevice = m_pDevice->GetPhysicalDevice();
    const auto& LogicalDevice  = m_pDevice->GetLogicalDevice();

    if (MemCI.NumResources == 0)
        DEVMEM_CHECK_CREATE_INFO("Vulkan requires at least one resource to choose memory type");

    if (MemCI.ppCompatibleResources == nullptr)
        DEVMEM_CHECK_CREATE_INFO("ppCompatibleResources must not be null");

    uint32_t MemoryTypeBits = ~0u;
    for (Uint32 i = 0; i < MemCI.NumResources; ++i)
    {
        auto* pResource = MemCI.ppCompatibleResources[i];

        if (RefCntAutoPtr<ITextureVk> pTexture{pResource, IID_TextureVk})
        {
            const auto* pTexVk = pTexture.ConstPtr<TextureVkImpl>();
            if (pTexVk->GetDesc().Usage != USAGE_SPARSE)
                DEVMEM_CHECK_CREATE_INFO("ppCompatibleResources[", i, "] must be created with USAGE_SPARSE");

            MemoryTypeBits &= LogicalDevice.GetImageMemoryRequirements(pTexVk->GetVkImage()).memoryTypeBits;
        }
        else if (RefCntAutoPtr<IBufferVk> pBuffer{pResource, IID_BufferVk})
        {
            const auto* pBuffVk = pBuffer.ConstPtr<BufferVkImpl>();
            if (pBuffVk->GetDesc().Usage != USAGE_SPARSE)
                DEVMEM_CHECK_CREATE_INFO("ppCompatibleResources[", i, "] must be created with USAGE_SPARSE");

            MemoryTypeBits &= LogicalDevice.GetBufferMemoryRequirements(pBuffVk->GetVkBuffer()).memoryTypeBits;
        }
        else
        {
            UNEXPECTED("unsupported resource type");
        }
    }

    if (MemoryTypeBits == 0)
        DEVMEM_CHECK_CREATE_INFO("ppCompatibleResources contains incompatible resources");

    static constexpr auto InvalidMemoryTypeIndex = VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex;

    uint32_t MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    if (MemoryTypeIndex == InvalidMemoryTypeIndex)
        DEVMEM_CHECK_CREATE_INFO("Failed to find memory type for resources in ppCompatibleResources");

    m_MemoryTypeIndex = MemoryTypeIndex;

    VkMemoryAllocateInfo MemAlloc{};
    MemAlloc.pNext           = nullptr;
    MemAlloc.sType           = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
    MemAlloc.allocationSize  = m_Desc.PageSize;
    MemAlloc.memoryTypeIndex = m_MemoryTypeIndex;

    const auto PageCount = StaticCast<size_t>(MemCI.InitialSize / m_Desc.PageSize);
    m_Pages.reserve(PageCount);

    for (size_t i = 0; i < PageCount; ++i)
        m_Pages.emplace_back(LogicalDevice.AllocateDeviceMemory(MemAlloc, m_Desc.Name)); // throw on error
}